

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<NoCopy,_kj::_::PromiseAndFulfillerAdapter<NoCopy>_>::reject
          (AdapterPromiseNode<NoCopy,_kj::_::PromiseAndFulfillerAdapter<NoCopy>_> *this,
          Exception *exception)

{
  ExceptionOr<NoCopy> EStack_1b8;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&EStack_1b8,exception);
    EStack_1b8.value.ptr.isSet = false;
    ExceptionOr<NoCopy>::operator=(&this->result,&EStack_1b8);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&EStack_1b8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }